

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapEditor.cc
# Opt level: O0

int main(int argc,char **argv)

{
  size_type sVar1;
  long in_RSI;
  int in_EDI;
  string *in_stack_00000018;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *in_stack_00000020;
  char key;
  string name;
  Mat src;
  Rect rect;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  double in_stack_fffffffffffffdb0;
  _InputArray *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  _InputOutputArray *in_stack_fffffffffffffdc0;
  double in_stack_fffffffffffffdc8;
  Scalar_<double> *in_stack_fffffffffffffdd0;
  int _width;
  int _height;
  Size_<int> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  char *in_stack_fffffffffffffdf8;
  string local_1e8 [39];
  char local_1c1;
  _InputArray local_1c0;
  undefined1 local_1a1 [40];
  undefined1 local_179 [40];
  allocator<char> local_151;
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [32];
  undefined1 local_e0 [36];
  Rect_<int> local_bc;
  undefined1 local_a0 [24];
  Size_<int> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [2];
  Mat *in_stack_ffffffffffffffc0;
  Obstacle *in_stack_ffffffffffffffc8;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  Rect_<int> local_20;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  _width = 0x4b0;
  _height = 900;
  local_10 = in_RSI;
  local_8 = in_EDI;
  cv::Rect_<int>::Rect_(&local_20,0,0,0x4b0,900);
  this_00 = &local_88;
  cv::Size_<int>::Size_(this_00,_width,_height);
  this_01 = local_80;
  cv::Mat::Mat((Mat *)this_01,this_00,0x10);
  cv::_InputOutputArray::_InputOutputArray
            (in_stack_fffffffffffffdc0,(Mat *)in_stack_fffffffffffffdb8);
  cv::Rect_<int>::Rect_(&local_bc,&local_20);
  cv::Scalar_<double>::Scalar_
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,(double)in_stack_fffffffffffffdc0,
             (double)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  cv::rectangle(local_a0,&local_bc,local_e0,0xffffffff,8,0);
  cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x140f71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)this_00,(allocator<char> *)CONCAT44(_height,_width));
  cv::namedWindow(local_100,1);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)this_00,(allocator<char> *)CONCAT44(_height,_width));
  cv::setMouseCallback(local_128,on_mouse,(void *)0x0);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)this_00,(allocator<char> *)CONCAT44(_height,_width));
  std::allocator<char>::~allocator(&local_151);
  if (1 < local_8) {
    in_stack_fffffffffffffdb8 =
         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(local_10 + 8);
    in_stack_fffffffffffffdc0 = (_InputOutputArray *)local_179;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)this_00,(allocator<char> *)CONCAT44(_height,_width));
    std::__cxx11::string::operator=(local_150,(string *)(local_179 + 1));
    std::__cxx11::string::~string((string *)(local_179 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_179);
  }
  do {
    while( true ) {
      mapDraw(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      this = (_InputArray *)local_1a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_01,(char *)this_00,(allocator<char> *)CONCAT44(_height,_width));
      cv::_InputArray::_InputArray
                (this,(Mat *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      cv::imshow((string *)(local_1a1 + 1),&local_1c0);
      cv::_InputArray::~_InputArray(&local_1c0);
      std::__cxx11::string::~string((string *)(local_1a1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1a1);
      in_stack_fffffffffffffdac = cv::waitKey(10);
      local_1c1 = (char)in_stack_fffffffffffffdac;
      if (local_1c1 == '\x1b') {
        printf("Exiting directly, map not saved.\n");
        goto LAB_001414be;
      }
      if (local_1c1 != 'e') break;
      sVar1 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size(&obstacle);
      if (2 < sVar1) {
        std::
        vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
        ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>&>
                  ((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    *)in_stack_fffffffffffffdc0,
                   (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                   in_stack_fffffffffffffdb8);
        std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::clear
                  ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)0x1413b0);
        printf("One obstacle is added.\n");
      }
    }
  } while (local_1c1 != 's');
  sVar1 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size(&obstacle);
  if (2 < sVar1) {
    std::
    vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
    ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>&>
              ((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                *)in_stack_fffffffffffffdc0,
               (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
               in_stack_fffffffffffffdb8);
    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::clear
              ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)0x141409);
  }
  std::operator+(in_stack_fffffffffffffdf8,this_01);
  std::operator+(in_stack_fffffffffffffdb8,(char *)this);
  mapSave(in_stack_00000020,in_stack_00000018);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf8);
  printf("Map saved.\n");
LAB_001414be:
  local_4 = 0;
  std::__cxx11::string::~string(local_150);
  cv::Mat::~Mat((Mat *)local_80);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
    const cv::Rect rect(0, 0, 1200, 900);
    cv::Mat src(cv::Size(1200, 900), CV_8UC3);
    cv::rectangle(src, rect, cv::Scalar(100, 100, 100), -1);
    cv::namedWindow("disp", cv::WINDOW_AUTOSIZE);
    cv::setMouseCallback("disp", on_mouse, NULL);
    std::string name = "test";
    if (argc >= 2) {
        name = std::string(argv[1]);
    }
    while (true) {
        mapDraw(obsts, obstacle, src);
        cv::imshow("disp", src);
        char key = cv::waitKey(10);
        if (key == 27) {
            printf("Exiting directly, map not saved.\n");
            break;
        } else if (key == 'e') {
            if (obstacle.size() < 3) continue;
            obsts.emplace_back(obstacle);
            obstacle.clear();
            printf("One obstacle is added.\n");
        } else if (key == 's') {
            if (obstacle.size() >= 3) {
                obsts.emplace_back(obstacle);
                obstacle.clear();
            }
            mapSave(obsts, "../maps/" + name + ".txt");
            printf("Map saved.\n");
            break;
        }
    }
    return 0;
}